

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,ConstStringParam value,Arena *arena)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  if ((string *)(this->tagged_ptr_).ptr_ != default_value) {
    psVar1 = UnsafeMutablePointer_abi_cxx11_(this);
    std::__cxx11::string::assign((char *)psVar1,(ulong)(value->_M_dataplus)._M_p);
    return;
  }
  pbVar2 = Arena::Create<std::__cxx11::string,std::__cxx11::string_const&>(arena,value);
  (this->tagged_ptr_).ptr_ = pbVar2;
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value,
                         ConstStringParam value, ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    tagged_ptr_.Set(Arena::Create<std::string>(arena, value));
  } else {
    UnsafeMutablePointer()->assign(value.data(), value.length());
  }
}